

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

void __thiscall QMessageBox::setTextFormat(QMessageBox *this,TextFormat format)

{
  QMessageBoxPrivate *this_00;
  QLabel *this_01;
  bool bVar1;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QLabel::setTextFormat(this_00->label,format);
  this_01 = this_00->label;
  if (format == RichText) {
    bVar1 = true;
  }
  else {
    if (format == AutoText) {
      QLabel::text(&local_40,this_01);
      QVar2.m_size = local_40.d.size | 0x8000000000000000;
      QVar2.field_0.m_data_utf16 = local_40.d.ptr;
      bVar1 = (bool)Qt::mightBeRichText(QVar2);
      QLabel::setWordWrap(this_01,bVar1);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_0050cab9;
    }
    bVar1 = false;
  }
  QLabel::setWordWrap(this_01,bVar1);
LAB_0050cab9:
  if (this_00->informativeLabel != (QLabel *)0x0) {
    QLabel::setTextFormat(this_00->informativeLabel,format);
  }
  QMessageBoxPrivate::updateSize(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::setTextFormat(Qt::TextFormat format)
{
    Q_D(QMessageBox);
    d->label->setTextFormat(format);
    d->label->setWordWrap(format == Qt::RichText
                    || (format == Qt::AutoText && Qt::mightBeRichText(d->label->text())));
    if (d->informativeLabel)
        d->informativeLabel->setTextFormat(format);
    d->updateSize();
}